

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O1

void bsp_remove_point_by_idx(void *handle,int idx)

{
  byte bVar1;
  long lVar2;
  float *point;
  ulong uVar3;
  bsp_tree *tree;
  
  bVar1 = *(byte *)((long)handle + 8);
  point = (float *)malloc((ulong)((uint)bVar1 * 4));
  if (bVar1 != 0) {
    lVar2 = *handle;
    uVar3 = 0;
    do {
      point[uVar3] = *(float *)(*(long *)(lVar2 + uVar3 * 8) + (long)idx * 4);
      uVar3 = uVar3 + 1;
    } while (bVar1 != uVar3);
  }
  _bsp_remove_point(*(bsp_node **)((long)handle + 0x10),point,(uint)bVar1);
  free(point);
  return;
}

Assistant:

void
bsp_remove_point_by_idx(
    void * handle,
    int idx )
{
    bsp_tree * tree;
    float * point;
    int i;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    point = (float *)malloc( sizeof(float) * tree->dimensions );
    assert( point != NULL );
    for ( i = 0; i < tree->dimensions; i++ ) {
        point[i] = tree->pointarrays[i][idx];
    }
    bsp_remove_point( handle, point );
    free( point );
}